

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::copy_file(path *from,path *to,copy_option option,error_code *ec)

{
  bool bVar1;
  value_type *pvVar2;
  int *piVar3;
  err_t local_b0;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  error_code *local_28;
  error_code *ec_local;
  path *ppStack_18;
  copy_option option_local;
  path *to_local;
  path *from_local;
  
  local_28 = ec;
  ec_local._4_4_ = option;
  ppStack_18 = to;
  to_local = from;
  pvVar2 = filesystem::path::c_str(from);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pvVar2,&local_49);
  pvVar2 = filesystem::path::c_str(ppStack_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pvVar2,&local_81);
  bVar1 = anon_unknown.dwarf_522f::copy_file_api
                    (&local_48,&local_80,ec_local._4_4_ == fail_if_exists);
  if (bVar1) {
    local_b0 = 0;
  }
  else {
    piVar3 = __errno_location();
    local_b0 = *piVar3;
  }
  anon_unknown.dwarf_522f::error
            (local_b0,to_local,ppStack_18,local_28,"boost::filesystem::copy_file");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy_file(const path& from, const path& to, copy_option option, error_code* ec)
  {
    error(!BOOST_COPY_FILE(from.c_str(), to.c_str(),
      option == fail_if_exists) ? BOOST_ERRNO : 0,
        from, to, ec, "boost::filesystem::copy_file");
  }